

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdftocsv.cpp
# Opt level: O3

bool cdftocsv::getrec(char *rec_,FILE *stream,int recsize_)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  
  if (recsize_ == 0) {
    return true;
  }
  lVar3 = 0;
  do {
    iVar2 = getc((FILE *)stream);
    bVar1 = iVar2 != -1;
    if (iVar2 == -1) {
      return bVar1;
    }
    rec_[lVar3] = (char)iVar2;
    lVar3 = lVar3 + 1;
  } while (recsize_ != (int)lVar3);
  return bVar1;
}

Assistant:

bool getrec(char *rec_, FILE *stream, int recsize_)
	{
		int totalread = 0;
		while (totalread != recsize_) {
			int ch = getc(stream);
			if (ch == EOF) {
				return false;
			}
			*rec_ = ch;
			totalread++;
			rec_++;
		}

		return true;

	}